

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

int lws_buflist_linear_copy(lws_buflist **head,size_t ofs,uint8_t *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  lws_buflist *plVar3;
  uint8_t *__dest;
  
  plVar3 = *head;
  __dest = buf;
  if (len != 0 && plVar3 != (lws_buflist *)0x0) {
    do {
      uVar1 = plVar3->len;
      uVar2 = ofs - uVar1;
      if (ofs < uVar1) {
        uVar2 = uVar1 - ofs;
        if (len <= uVar1 - ofs) {
          uVar2 = len;
        }
        memcpy(__dest,(void *)((long)&plVar3[1].pos + ofs),uVar2);
        len = len - uVar2;
        __dest = __dest + uVar2;
        uVar2 = 0;
      }
      plVar3 = plVar3->next;
    } while ((plVar3 != (lws_buflist *)0x0) && (ofs = uVar2, len != 0));
  }
  return (int)__dest - (int)buf;
}

Assistant:

int
lws_buflist_linear_copy(struct lws_buflist **head, size_t ofs, uint8_t *buf,
			size_t len)
{
	struct lws_buflist *p = *head;
	uint8_t *obuf = buf;
	size_t s;

	while (p && len) {
		if (ofs < p->len) {
			s = p->len - ofs;
			if (s > len)
				s = len;
			memcpy(buf, ((uint8_t *)&p[1]) + LWS_PRE + ofs, s);
			len -= s;
			buf += s;
			ofs = 0;
		} else
			ofs -= p->len;
		p = p->next;
	}

	return lws_ptr_diff(buf, obuf);
}